

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O2

GLuint deqp::egl::anon_unknown_0::anon_unknown_5::createTexture(Functions *gl,TestConfig *config)

{
  Functions *pFVar1;
  GLenum GVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int y;
  int iVar6;
  uchar local_69;
  int local_68;
  GLuint texture;
  TestConfig *local_60;
  int local_54;
  Functions *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = 0;
  iVar3 = 0;
  local_60 = config;
  local_50 = gl;
  while (pFVar1 = local_50, iVar3 < local_60->textureWidth) {
    iVar5 = 0;
    iVar4 = 0;
    local_54 = iVar3;
    for (iVar6 = 0; iVar6 < local_60->textureHeight; iVar6 = iVar6 + 1) {
      local_69 = (uchar)((iVar3 * 0xff) / 0xff);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&data,&local_69);
      local_69 = (uchar)(iVar5 / 0xff);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&data,&local_69);
      local_69 = (uchar)(iVar4 / 0xfe01);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&data,&local_69);
      local_69 = 0xff;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&data,&local_69);
      iVar4 = iVar4 + local_68;
      iVar5 = iVar5 + 0xff;
    }
    local_68 = local_68 + 0xff;
    iVar3 = local_54 + 1;
  }
  (*local_50->genTextures)(1,&texture);
  GVar2 = (*pFVar1->getError)();
  glu::checkError(GVar2,"glGenTextures()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x119);
  (*pFVar1->bindTexture)(0xde1,texture);
  GVar2 = (*pFVar1->getError)();
  glu::checkError(GVar2,"glBindTexture()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x11b);
  (*pFVar1->texParameteri)(0xde1,0x2801,0x2601);
  GVar2 = (*pFVar1->getError)();
  glu::checkError(GVar2,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x11d);
  (*pFVar1->texParameteri)(0xde1,0x2800,0x2601);
  GVar2 = (*pFVar1->getError)();
  glu::checkError(GVar2,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x11f);
  (*pFVar1->texParameteri)(0xde1,0x2803,0x812f);
  GVar2 = (*pFVar1->getError)();
  glu::checkError(GVar2,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x121);
  (*pFVar1->texParameteri)(0xde1,0x2802,0x812f);
  GVar2 = (*pFVar1->getError)();
  glu::checkError(GVar2,"glTexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x123);
  (*pFVar1->texImage2D)
            (0xde1,0,0x1908,local_60->textureWidth,local_60->textureWidth,0,0x1908,0x1401,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  GVar2 = (*pFVar1->getError)();
  glu::checkError(GVar2,"glTexImage2D()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x125);
  (*pFVar1->bindTexture)(0xde1,0);
  GVar2 = (*pFVar1->getError)();
  glu::checkError(GVar2,"glBindTexture()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x127);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return texture;
}

Assistant:

GLuint createTexture (const glw::Functions& gl, const TestConfig& config)
{
	GLuint			texture;
	vector<deUint8>	data;

	createTextureData(data, config);

	gl.genTextures(1, &texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures()");
	gl.bindTexture(GL_TEXTURE_2D, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture()");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri");
	gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, config.textureWidth, config.textureWidth, 0, GL_RGBA, GL_UNSIGNED_BYTE, &(data[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D()");
	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture()");

	return texture;
}